

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IsFlat
          (CordRepBtree *this,size_t offset,size_t n,string_view *fragment)

{
  CordRep *this_00;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view local_78;
  size_t local_68;
  char *local_60;
  CordRep *local_58;
  CordRep *edge;
  Position front;
  CordRepBtree *node;
  int height;
  string_view *fragment_local;
  size_t n_local;
  size_t offset_local;
  CordRepBtree *this_local;
  
  if ((this->super_CordRep).length < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3d7,
                  "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
                 );
  }
  if ((this->super_CordRep).length - n < offset) {
    __assert_fail("offset <= this->length - n",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3d8,
                  "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
                 );
  }
  if (n != 0) {
    node._4_4_ = CordRepBtree::height(this);
    front.n = (size_t)this;
    n_local = offset;
    while( true ) {
      _edge = IndexOf((CordRepBtree *)front.n,n_local);
      local_58 = Edge((CordRepBtree *)front.n,(size_t)edge);
      if (local_58->length < front.index + n) break;
      node._4_4_ = node._4_4_ + -1;
      if (node._4_4_ < 0) {
        if (fragment != (string_view *)0x0) {
          local_78 = EdgeData(local_58);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&local_78,front.index,n);
          local_68 = bVar1._M_len;
          fragment->_M_len = local_68;
          local_60 = bVar1._M_str;
          fragment->_M_str = local_60;
        }
        return true;
      }
      n_local = front.index;
      this_00 = Edge((CordRepBtree *)front.n,(size_t)edge);
      front.n = (size_t)CordRep::btree(this_00);
    }
  }
  return false;
}

Assistant:

bool CordRepBtree::IsFlat(size_t offset, const size_t n,
                          absl::string_view* fragment) const {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return false;
  int height = this->height();
  const CordRepBtree* node = this;
  for (;;) {
    const Position front = node->IndexOf(offset);
    const CordRep* edge = node->Edge(front.index);
    if (edge->length < front.n + n) return false;
    if (--height < 0) {
      if (fragment) *fragment = EdgeData(edge).substr(front.n, n);
      return true;
    }
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}